

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall
pbrt::ParameterDictionary::ParameterDictionary
          (ParameterDictionary *this,ParsedParameterVector *p0,ParsedParameterVector *params1,
          RGBColorSpace *colorSpace)

{
  size_t sVar1;
  ParsedParameter *pPVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_28;
  reverse_iterator<pbrt::ParsedParameter_*const_*> local_20;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&this->params,p0);
  this->colorSpace = colorSpace;
  paVar3 = &(this->params).field_2;
  paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar1 = (this->params).nStored;
  if (paVar4 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar4 = paVar3;
  }
  if ((sVar1 != 0) && (puVar6 = (undefined8 *)((long)paVar4 + sVar1 * 8 + -8), paVar4 < puVar6)) {
    do {
      puVar5 = (undefined8 *)((long)paVar4 + 8);
      pPVar2 = paVar4->fixed[0];
      paVar4->fixed[0] = (ParsedParameter *)*puVar6;
      *puVar6 = pPVar2;
      puVar6 = puVar6 + -1;
      paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)puVar5;
    } while (puVar5 < puVar6);
  }
  if (colorSpace == (RGBColorSpace *)0x0) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
               ,0xaa,"Check failed: %s",(char (*) [22])"colorSpace != nullptr");
  }
  paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar3 = paVar4;
  }
  local_28.current = (ParsedParameter **)&params1->field_2;
  if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
       *)params1->ptr !=
      (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
       *)0x0) {
    local_28.current = params1->ptr;
  }
  local_20.current = local_28.current + params1->nStored * 8;
  InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>::
  insert<std::reverse_iterator<pbrt::ParsedParameter*const*>>
            ((InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
              *)this,paVar3->fixed + sVar1,&local_20,&local_28);
  checkParameterTypes(this);
  return;
}

Assistant:

ParameterDictionary::ParameterDictionary(ParsedParameterVector p0,
                                         const ParsedParameterVector &params1,
                                         const RGBColorSpace *colorSpace)
    : params(std::move(p0)), colorSpace(colorSpace) {
    std::reverse(params.begin(), params.end());
    CHECK(colorSpace != nullptr);
    params.insert(params.end(), params1.rbegin(), params1.rend());
    checkParameterTypes();
}